

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-impl.hpp
# Opt level: O3

void yactfr::internal::TraceTypeImpl::setDispName<yactfr::VariantTypeOption<unsigned_long_long>>
               (VariantTypeOption<unsigned_long_long> *obj,string *name,bool removeUnderscore)

{
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (((int)CONCAT71(in_register_00000011,removeUnderscore) != 0) &&
     (*(name->_M_dataplus)._M_p == '_')) {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)name);
    boost::optional_detail::
    optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::assign(&(obj->_dispName).super_type,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  assign(&(obj->_dispName).super_type,name);
  return;
}

Assistant:

static void setDispName(const ObjT& obj, const std::string& name, const bool removeUnderscore)
    {
        if (removeUnderscore && name.c_str()[0] == '_') {
            obj._dispName = name.substr(1);
        } else {
            obj._dispName = name;
        }
    }